

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::GetOrCreateValue(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                   *this)

{
  int iVar1;
  ThreadLocalValueHolderBase *base;
  ValueHolder *__pointer;
  undefined4 extraout_var;
  ostream *poVar2;
  GTestLog local_1c;
  
  base = (ThreadLocalValueHolderBase *)pthread_getspecific(this->key_);
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    iVar1 = (*((this->default_factory_)._M_t.
               super___uniq_ptr_impl<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory_*,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
               .
               super__Head_base<0UL,_testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory_*,_false>
              ._M_head_impl)->_vptr_ValueHolderFactory[2])();
    __pointer = (ValueHolder *)CONCAT44(extraout_var,iVar1);
    iVar1 = pthread_setspecific(this->key_,__pointer);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-port.h"
                         ,0x73b);
      poVar2 = std::operator<<((ostream *)&std::cerr,"pthread_setspecific(key_, holder_base)");
      poVar2 = std::operator<<(poVar2,"failed with error ");
      std::ostream::operator<<(poVar2,iVar1);
      GTestLog::~GTestLog(&local_1c);
    }
  }
  else {
    __pointer = CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                          (base);
  }
  return &__pointer->value_;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != nullptr) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = default_factory_->MakeNewHolder();
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }